

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bzlib.c
# Opt level: O2

void prepare_new_block(EState *s)

{
  long lVar1;
  
  s->nblock = 0;
  s->numZ = 0;
  s->state_out_pos = 0;
  s->blockCRC = 0xffffffff;
  for (lVar1 = 0; lVar1 != 0x100; lVar1 = lVar1 + 1) {
    s->inUse[lVar1] = '\0';
  }
  s->blockNo = s->blockNo + 1;
  return;
}

Assistant:

static
void prepare_new_block ( EState* s )
{
   Int32 i;
   s->nblock = 0;
   s->numZ = 0;
   s->state_out_pos = 0;
   BZ_INITIALISE_CRC ( s->blockCRC );
   for (i = 0; i < 256; i++) s->inUse[i] = False;
   s->blockNo++;
}